

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmlite_init.c
# Opt level: O0

int init_globals(void)

{
  int iVar1;
  int local_4;
  
  iVar1 = CRYPTO_alloc_init();
  if ((((iVar1 == 0) || (iVar1 = sm2_group_init(), iVar1 == 0)) ||
      (iVar1 = sm9_group_init(), iVar1 == 0)) || (iVar1 = sm9_pairing_init(), iVar1 == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int init_globals()
{
    if (CRYPTO_alloc_init() == GML_ERROR)
        goto end;

    /* init sm2 curve parameters and methods */
    if (sm2_group_init() == GML_ERROR)
        goto end;

    /* init sm9 curve parameters and methods */
    if (sm9_group_init() == GML_ERROR || 
        sm9_pairing_init() == GML_ERROR)
        goto end;

    return GML_OK;
end:
    return GML_ERROR;
}